

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test31(char *infile,char *password,char *outfile,char *xarg)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  qpdf_error e;
  qpdf_oh trailer;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  qpdf_read(qpdf,infile,password);
  uVar3 = qpdf_get_trailer(qpdf);
  lVar1 = qpdf_oh_get_int_value(qpdf,uVar3);
  if (lVar1 != 0) {
    __assert_fail("qpdf_oh_get_int_value(qpdf, trailer) == 0LL",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x3bd,"void test31(const char *, const char *, const char *, const char *)");
  }
  iVar4 = qpdf_has_error(qpdf);
  if (iVar4 != 0) {
    __assert_fail("!qpdf_has_error(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x3be,"void test31(const char *, const char *, const char *, const char *)");
  }
  iVar4 = qpdf_more_warnings(qpdf);
  if (iVar4 == 0) {
    __assert_fail("qpdf_more_warnings(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x3bf,"void test31(const char *, const char *, const char *, const char *)");
  }
  uVar2 = qpdf_next_warning(qpdf);
  iVar4 = qpdf_get_error_code(qpdf,uVar2);
  if (iVar4 == 7) {
    report_errors();
    return;
  }
  __assert_fail("qpdf_get_error_code(qpdf, e) == qpdf_e_object",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x3c1,"void test31(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test31(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* Make sure type warnings have a specific error code. This test
     * case is designed for minimal.pdf.
     */
    qpdf_read(qpdf, infile, password);
    qpdf_oh trailer = qpdf_get_trailer(qpdf);
    assert(qpdf_oh_get_int_value(qpdf, trailer) == 0LL);
    assert(!qpdf_has_error(qpdf));
    assert(qpdf_more_warnings(qpdf));
    qpdf_error e = qpdf_next_warning(qpdf);
    assert(qpdf_get_error_code(qpdf, e) == qpdf_e_object);
    report_errors();
}